

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O0

void __thiscall DIS::ServiceRequestPdu::ServiceRequestPdu(ServiceRequestPdu *this)

{
  ServiceRequestPdu *this_local;
  
  LogisticsFamilyPdu::LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  (this->super_LogisticsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__ServiceRequestPdu_00268ec8;
  EntityID::EntityID(&this->_requestingEntityID);
  EntityID::EntityID(&this->_servicingEntityID);
  this->_serviceTypeRequested = '\0';
  this->_numberOfSupplyTypes = '\0';
  this->_serviceRequestPadding = 0;
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::vector(&this->_supplies);
  PduSuperclass::setPduType((PduSuperclass *)this,'\x05');
  return;
}

Assistant:

ServiceRequestPdu::ServiceRequestPdu() : LogisticsFamilyPdu(),
   _requestingEntityID(), 
   _servicingEntityID(), 
   _serviceTypeRequested(0), 
   _numberOfSupplyTypes(0), 
   _serviceRequestPadding(0)
{
    setPduType( 5 );
}